

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsa_StrDup(PaAlsaHostApiRepresentation *alsaApi,char **dst,char *src)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  PaError local_24;
  int len;
  PaError result;
  char *src_local;
  char **dst_local;
  PaAlsaHostApiRepresentation *alsaApi_local;
  
  local_24 = 0;
  sVar2 = strlen(src);
  iVar1 = (int)sVar2 + 1;
  pcVar3 = (char *)PaUtil_GroupAllocateMemory(alsaApi->allocations,(long)iVar1);
  *dst = pcVar3;
  if (pcVar3 == (char *)0x0) {
    PaUtil_DebugPrint(
                     "Expression \'*dst = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1082\n"
                     );
    local_24 = -0x2708;
  }
  else {
    strncpy(*dst,src,(long)iVar1);
  }
  return local_24;
}

Assistant:

static PaError PaAlsa_StrDup( PaAlsaHostApiRepresentation *alsaApi,
        char **dst,
        const char *src)
{
    PaError result = paNoError;
    int len = strlen( src ) + 1;

    /* PA_DEBUG(("PaStrDup %s %d\n", src, len)); */

    PA_UNLESS( *dst = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len ),
            paInsufficientMemory );
    strncpy( *dst, src, len );

error:
    return result;
}